

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_owner_parse.c
# Opt level: O2

void test_owner_parse(void)

{
  int iVar1;
  wchar_t wVar2;
  char *errstr;
  cpio_owner owner;
  
  iVar1 = owner_parse("root",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L':',(uint)(iVar1 == 0),"0 == owner_parse(ROOT, &owner, &errstr)",(void *)0x0);
  wVar2 = int_in_list(owner.uid,root_uids,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'<',wVar2,
                   "int_in_list(owner.uid, root_uids, sizeof(root_uids)/sizeof(root_uids[0]))",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'=',-1,"-1",(long)owner.gid,"owner.gid",(void *)0x0);
  free_cpio_owner(&owner);
  iVar1 = owner_parse("root:",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'@',(uint)(iVar1 == 0),"0 == owner_parse(ROOT \":\", &owner, &errstr)",
                   (void *)0x0);
  wVar2 = int_in_list(owner.uid,root_uids,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'B',wVar2,
                   "int_in_list(owner.uid, root_uids, sizeof(root_uids)/sizeof(root_uids[0]))",
                   (void *)0x0);
  wVar2 = int_in_list(owner.gid,root_gids,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'D',wVar2,
                   "int_in_list(owner.gid, root_gids, sizeof(root_gids)/sizeof(root_gids[0]))",
                   (void *)0x0);
  free_cpio_owner(&owner);
  iVar1 = owner_parse("root.",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'G',(uint)(iVar1 == 0),"0 == owner_parse(ROOT \".\", &owner, &errstr)",
                   (void *)0x0);
  wVar2 = int_in_list(owner.uid,root_uids,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'I',wVar2,
                   "int_in_list(owner.uid, root_uids, sizeof(root_uids)/sizeof(root_uids[0]))",
                   (void *)0x0);
  wVar2 = int_in_list(owner.gid,root_gids,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'K',wVar2,
                   "int_in_list(owner.gid, root_gids, sizeof(root_gids)/sizeof(root_gids[0]))",
                   (void *)0x0);
  free_cpio_owner(&owner);
  iVar1 = owner_parse("111",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'N',(uint)(iVar1 == 0),"0 == owner_parse(\"111\", &owner, &errstr)",(void *)0x0
                  );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'O',0x6f,"111",(long)owner.uid,"owner.uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'P',-1,"-1",(long)owner.gid,"owner.gid",(void *)0x0);
  free_cpio_owner(&owner);
  iVar1 = owner_parse("112:",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'S',(uint)(iVar1 == 0),"0 == owner_parse(\"112:\", &owner, &errstr)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'T',0x70,"112",(long)owner.uid,"owner.uid",(void *)0x0);
  free_cpio_owner(&owner);
  iVar1 = owner_parse("113.",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'X',(uint)(iVar1 == 0),"0 == owner_parse(\"113.\", &owner, &errstr)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'Y',0x71,"113",(long)owner.uid,"owner.uid",(void *)0x0);
  free_cpio_owner(&owner);
  iVar1 = owner_parse(":114",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L']',(uint)(iVar1 == 0),"0 == owner_parse(\":114\", &owner, &errstr)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'^',-1,"-1",(long)owner.uid,"owner.uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'_',0x72,"114",(long)owner.gid,"owner.gid",(void *)0x0);
  free_cpio_owner(&owner);
  iVar1 = owner_parse(".115",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'b',(uint)(iVar1 == 0),"0 == owner_parse(\".115\", &owner, &errstr)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'c',-1,"-1",(long)owner.uid,"owner.uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'd',0x73,"115",(long)owner.gid,"owner.gid",(void *)0x0);
  free_cpio_owner(&owner);
  iVar1 = owner_parse("116:117",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'g',(uint)(iVar1 == 0),"0 == owner_parse(\"116:117\", &owner, &errstr)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'h',0x74,"116",(long)owner.uid,"owner.uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                      ,L'i',0x75,"117",(long)owner.gid,"owner.gid",(void *)0x0);
  free_cpio_owner(&owner);
  errstr = (char *)0x0;
  iVar1 = owner_parse(":nonexistentgroup",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L's',(uint)(iVar1 != 0),
                   "0 != owner_parse(\":nonexistentgroup\", &owner, &errstr)",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
             ,L't',errstr,"errstr","Couldn\'t lookup group ``nonexistentgroup\'\'",
             "\"Couldn\'t lookup group ``nonexistentgroup\'\'\"",(void *)0x0,L'\0');
  free_cpio_owner(&owner);
  errstr = (char *)0x0;
  iVar1 = owner_parse("root:nonexistentgroup",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'x',(uint)(iVar1 != 0),
                   "0 != owner_parse(ROOT \":nonexistentgroup\", &owner, &errstr)",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
             ,L'y',errstr,"errstr","Couldn\'t lookup group ``nonexistentgroup\'\'",
             "\"Couldn\'t lookup group ``nonexistentgroup\'\'\"",(void *)0x0,L'\0');
  free_cpio_owner(&owner);
  errstr = (char *)0x0;
  iVar1 = owner_parse("nonexistentuser:nonexistentgroup",&owner,&errstr);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
                   ,L'~',(uint)(iVar1 != 0),
                   "0 != owner_parse(\"nonexistentuser:nonexistentgroup\", &owner, &errstr)",
                   (void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_owner_parse.c"
             ,L'\x7f',errstr,"errstr","Couldn\'t lookup user ``nonexistentuser\'\'",
             "\"Couldn\'t lookup user ``nonexistentuser\'\'\"",(void *)0x0,L'\0');
  free_cpio_owner(&owner);
  return;
}

Assistant:

DEFINE_TEST(test_owner_parse)
{
#if !defined(ROOT)
	skipping("No uid/gid configuration for this OS");
#else
	struct cpio_owner owner;
	const char *errstr;

	assert(0 == owner_parse(ROOT, &owner, &errstr));
	assert(int_in_list(owner.uid, root_uids,
		sizeof(root_uids)/sizeof(root_uids[0])));
	assertEqualInt(-1, owner.gid);
	free_cpio_owner(&owner);

	assert(0 == owner_parse(ROOT ":", &owner, &errstr));
	assert(int_in_list(owner.uid, root_uids,
		sizeof(root_uids)/sizeof(root_uids[0])));
	assert(int_in_list(owner.gid, root_gids,
		sizeof(root_gids)/sizeof(root_gids[0])));
	free_cpio_owner(&owner);

	assert(0 == owner_parse(ROOT ".", &owner, &errstr));
	assert(int_in_list(owner.uid, root_uids,
		sizeof(root_uids)/sizeof(root_uids[0])));
	assert(int_in_list(owner.gid, root_gids,
		sizeof(root_gids)/sizeof(root_gids[0])));
	free_cpio_owner(&owner);

	assert(0 == owner_parse("111", &owner, &errstr));
	assertEqualInt(111, owner.uid);
	assertEqualInt(-1, owner.gid);
	free_cpio_owner(&owner);

	assert(0 == owner_parse("112:", &owner, &errstr));
	assertEqualInt(112, owner.uid);
	/* Can't assert gid, since we don't know gid for user #112. */
	free_cpio_owner(&owner);

	assert(0 == owner_parse("113.", &owner, &errstr));
	assertEqualInt(113, owner.uid);
	/* Can't assert gid, since we don't know gid for user #113. */
	free_cpio_owner(&owner);

	assert(0 == owner_parse(":114", &owner, &errstr));
	assertEqualInt(-1, owner.uid);
	assertEqualInt(114, owner.gid);
	free_cpio_owner(&owner);

	assert(0 == owner_parse(".115", &owner, &errstr));
	assertEqualInt(-1, owner.uid);
	assertEqualInt(115, owner.gid);
	free_cpio_owner(&owner);

	assert(0 == owner_parse("116:117", &owner, &errstr));
	assertEqualInt(116, owner.uid);
	assertEqualInt(117, owner.gid);
	free_cpio_owner(&owner);

	/*
	 * TODO: Lookup current user/group name, build strings and
	 * use those to verify username/groupname lookups for ordinary
	 * users.
	 */

	errstr = NULL;
	assert(0 != owner_parse(":nonexistentgroup", &owner, &errstr));
	assertEqualString(errstr, "Couldn't lookup group ``nonexistentgroup''");
	free_cpio_owner(&owner);

	errstr = NULL;
	assert(0 != owner_parse(ROOT ":nonexistentgroup", &owner, &errstr));
	assertEqualString(errstr, "Couldn't lookup group ``nonexistentgroup''");
	free_cpio_owner(&owner);

	errstr = NULL;
	assert(0 != owner_parse("nonexistentuser:nonexistentgroup", &owner,
	    &errstr));
	assertEqualString(errstr, "Couldn't lookup user ``nonexistentuser''");
	free_cpio_owner(&owner);
#endif
}